

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

bool __thiscall
cbtSingleSweepCallback::process(cbtSingleSweepCallback *this,cbtBroadphaseProxy *proxy)

{
  float fVar1;
  ConvexResultCallback *pCVar2;
  cbtCollisionObject *collisionObject;
  undefined8 uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  
  pCVar2 = this->m_resultCallback;
  auVar5 = ZEXT816(0) << 0x40;
  fVar1 = pCVar2->m_closestHitFraction;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    collisionObject = (cbtCollisionObject *)proxy->m_clientObject;
    iVar4 = (*pCVar2->_vptr_ConvexResultCallback[2])(pCVar2,collisionObject->m_broadphaseHandle);
    auVar5 = ZEXT816(0) << 0x40;
    if ((char)iVar4 != '\0') {
      cbtCollisionWorld::objectQuerySingle
                (this->m_castShape,&this->m_convexFromTrans,&this->m_convexToTrans,collisionObject,
                 collisionObject->m_collisionShape,&collisionObject->m_worldTransform,
                 this->m_resultCallback,this->m_allowedCcdPenetration);
      auVar5 = ZEXT816(0) << 0x40;
    }
  }
  uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar5,4);
  return (bool)((byte)uVar3 & 1);
}

Assistant:

virtual bool process(const cbtBroadphaseProxy* proxy)
	{
		///terminate further convex sweep tests, once the closestHitFraction reached zero
		if (m_resultCallback.m_closestHitFraction == cbtScalar(0.f))
			return false;

		cbtCollisionObject* collisionObject = (cbtCollisionObject*)proxy->m_clientObject;

		//only perform raycast if filterMask matches
		if (m_resultCallback.needsCollision(collisionObject->getBroadphaseHandle()))
		{
			//RigidcollisionObject* collisionObject = ctrl->GetRigidcollisionObject();
			m_world->objectQuerySingle(m_castShape, m_convexFromTrans, m_convexToTrans,
									   collisionObject,
									   collisionObject->getCollisionShape(),
									   collisionObject->getWorldTransform(),
									   m_resultCallback,
									   m_allowedCcdPenetration);
		}

		return true;
	}